

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O1

void __thiscall
tchecker::parsing::system_declaration_t::system_declaration_t
          (system_declaration_t *this,string *name,attributes_t *attr,string *context)

{
  pointer pcVar1;
  invalid_argument *this_00;
  
  declaration_t::declaration_t(&this->super_declaration_t,attr,context);
  (this->super_declaration_t)._vptr_declaration_t =
       (_func_int **)&PTR__system_declaration_t_001e4d40;
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_name,pcVar1,pcVar1 + name->_M_string_length);
  (this->_decl).
  super__Vector_base<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_decl).
  super__Vector_base<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_decl).
  super__Vector_base<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_ints)._M_h._M_buckets = &(this->_ints)._M_h._M_single_bucket;
  (this->_ints)._M_h._M_bucket_count = 1;
  (this->_ints)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_ints)._M_h._M_element_count = 0;
  (this->_ints)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_ints)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_ints)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_clocks)._M_h._M_buckets = &(this->_clocks)._M_h._M_single_bucket;
  (this->_clocks)._M_h._M_bucket_count = 1;
  (this->_clocks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_clocks)._M_h._M_element_count = 0;
  (this->_clocks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_clocks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_clocks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_procs)._M_h._M_buckets = &(this->_procs)._M_h._M_single_bucket;
  (this->_procs)._M_h._M_bucket_count = 1;
  (this->_procs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_procs)._M_h._M_element_count = 0;
  (this->_procs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_procs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_procs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_events)._M_h._M_buckets = &(this->_events)._M_h._M_single_bucket;
  (this->_events)._M_h._M_bucket_count = 1;
  (this->_events)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_events)._M_h._M_element_count = 0;
  (this->_events)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_events)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_events)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_locs)._M_h._M_buckets = &(this->_locs)._M_h._M_single_bucket;
  (this->_locs)._M_h._M_bucket_count = 1;
  (this->_locs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_locs)._M_h._M_element_count = 0;
  (this->_locs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_locs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_locs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (name->_M_string_length != 0) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"system declaration has empty name");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

system_declaration_t::system_declaration_t(std::string const & name, tchecker::parsing::attributes_t const & attr,
                                           std::string const & context)
    : tchecker::parsing::declaration_t(attr, context), _name(name)
{
  if (name.empty())
    throw std::invalid_argument("system declaration has empty name");
}